

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::lazyPrint(ConsoleReporter *this)

{
  if ((this->super_StreamingReporterBase).currentTestRunInfo.used == false) {
    lazyPrintRunInfo(this);
  }
  if ((this->super_StreamingReporterBase).currentGroupInfo.used == false) {
    lazyPrintGroupInfo(this);
  }
  if (this->m_headerPrinted == false) {
    printTestCaseAndSectionHeader(this);
    this->m_headerPrinted = true;
  }
  return;
}

Assistant:

void lazyPrint() {

            if( !currentTestRunInfo.used )
                lazyPrintRunInfo();
            if( !currentGroupInfo.used )
                lazyPrintGroupInfo();

            if( !m_headerPrinted ) {
                printTestCaseAndSectionHeader();
                m_headerPrinted = true;
            }
        }